

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStaticEnumerator.cpp
# Opt level: O2

JavascriptString * __thiscall
Js::JavascriptStaticEnumerator::MoveAndGetNextFromEnumerator
          (JavascriptStaticEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  JavascriptEnumerator *pJVar1;
  int iVar2;
  JavascriptEnumerator *in_RAX;
  undefined4 extraout_var;
  WriteBarrierPtr<Js::JavascriptEnumerator> local_38;
  
  local_38.ptr = in_RAX;
  while( true ) {
    pJVar1 = (this->currentEnumerator).ptr;
    if (pJVar1 == (JavascriptEnumerator *)0x0) {
      return (JavascriptString *)0x0;
    }
    iVar2 = (*(pJVar1->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[99])(pJVar1,propertyId,attributes);
    if ((JavascriptString *)CONCAT44(extraout_var,iVar2) != (JavascriptString *)0x0) break;
    if ((this->currentEnumerator).ptr == (this->prefixEnumerator).ptr) {
      Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::WriteBarrierPtr
                (&local_38,&this->arrayEnumerator);
    }
    else {
      local_38.ptr = (JavascriptEnumerator *)0x0;
    }
    Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::WriteBarrierSet
              (&this->currentEnumerator,local_38.ptr);
  }
  return (JavascriptString *)CONCAT44(extraout_var,iVar2);
}

Assistant:

JavascriptString * JavascriptStaticEnumerator::MoveAndGetNextFromEnumerator(PropertyId& propertyId, PropertyAttributes* attributes)
    {
        while (this->currentEnumerator)
        {
            JavascriptString * currentIndex = this->currentEnumerator->MoveAndGetNext(propertyId, attributes);
            if (currentIndex != nullptr)
            {
                return currentIndex;
            }
            this->currentEnumerator = (this->currentEnumerator == this->prefixEnumerator) ? this->arrayEnumerator : nullptr;
        }

        return nullptr;
    }